

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O2

void __thiscall wasm::InstrumentLocals::visitLocalSet(InstrumentLocals *this,LocalSet *curr)

{
  Index x;
  bool bVar1;
  BasicType BVar2;
  HeapType HVar3;
  size_t *psVar4;
  Call *pCVar5;
  char *pcVar6;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Const *local_80;
  Const *local_78;
  Expression *local_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Builder local_50;
  Builder builder;
  Type type;
  size_t local_38;
  
  if (curr->value->_id == PopId) {
    return;
  }
  local_50.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
       ).super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.
       super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.currModule
  ;
  builder.wasm = (Module *)(curr->value->type).id;
  bVar1 = wasm::Type::isFunction((Type *)&builder);
  if ((bVar1) && (HVar3 = wasm::Type::getHeapType((Type *)&builder), HVar3.id != 1)) {
    return;
  }
  bVar1 = wasm::Type::isRef((Type *)&builder);
  if (bVar1) {
    HVar3 = wasm::Type::getHeapType((Type *)&builder);
    if (HVar3.id == 0) {
      bVar1 = wasm::Type::isNullable((Type *)&builder);
      if (!bVar1) goto LAB_00889e0c;
      psVar4 = &set_externref;
    }
    else {
      if ((HVar3.id != 1) || (bVar1 = wasm::Type::isNullable((Type *)&builder), !bVar1)) {
LAB_00889e0c:
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x86);
      }
      psVar4 = &set_funcref;
    }
    goto LAB_00889d66;
  }
  bVar1 = wasm::Type::isTuple(&curr->value->type);
  if (bVar1) {
    pcVar6 = "!curr->value->type.isTuple() && \"Unexpected tuple type\"";
LAB_00889e34:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                  ,0x89,"void wasm::InstrumentLocals::visitLocalSet(LocalSet *)");
  }
  if (6 < (curr->value->type).id) {
    pcVar6 = "curr->value->type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00889e34;
  }
  BVar2 = wasm::Type::getBasic((Type *)&builder);
  switch(BVar2) {
  case none:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                       ,0x9c);
  case unreachable:
  case i64:
    goto switchD_00889d28_caseD_1;
  case i32:
    psVar4 = &set_i32;
    break;
  case f32:
    psVar4 = &set_f32;
    break;
  case f64:
    psVar4 = &set_f64;
    break;
  case v128:
    psVar4 = &set_v128;
    break;
  default:
    pcVar6 = (char *)0x0;
    local_38 = 0;
    goto LAB_00889d71;
  }
LAB_00889d66:
  local_38 = *psVar4;
  pcVar6 = (char *)psVar4[1];
LAB_00889d71:
  x = this->id;
  this->id = x + 1;
  local_80 = Builder::makeConst<int>(&local_50,x);
  local_78 = Builder::makeConst<int>(&local_50,curr->index);
  local_70 = curr->value;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_68,__l,
             (allocator_type *)((long)&type.id + 7));
  target.super_IString.str._M_str = pcVar6;
  target.super_IString.str._M_len = local_38;
  pCVar5 = Builder::makeCall(&local_50,target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_68,(Type)(curr->value->type).id,false);
  curr->value = (Expression *)pCVar5;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_68);
switchD_00889d28_caseD_1:
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // We don't instrument pop instructions. They are automatically deleted when
    // writing binary and generated when reading binary, so they don't work with
    // local set/get instrumentation.
    if (curr->value->is<Pop>()) {
      return;
    }

    Builder builder(*getModule());
    Name import;
    auto type = curr->value->type;
    if (type.isFunction() && type.getHeapType() != HeapType::func) {
      // FIXME: support typed function references
      return;
    }
    if (type.isRef()) {
      auto heapType = type.getHeapType();
      if (heapType == HeapType::func && type.isNullable()) {
        import = set_funcref;
      } else if (heapType == HeapType::ext && type.isNullable()) {
        import = set_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->value->type);
      switch (type.getBasic()) {
        case Type::i32:
          import = set_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = set_f32;
          break;
        case Type::f64:
          import = set_f64;
          break;
        case Type::v128:
          import = set_v128;
          break;
        case Type::unreachable:
          return; // nothing to do here
        case Type::none:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    curr->value = builder.makeCall(import,
                                   {builder.makeConst(int32_t(id++)),
                                    builder.makeConst(int32_t(curr->index)),
                                    curr->value},
                                   curr->value->type);
  }